

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcxx.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  unsigned_long uVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"GNU GCC libstdc++");
  poVar1 = std::operator<<(poVar1," ");
  uVar2 = libcxx_release();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  std::operator<<(poVar1,"\n");
  return 0;
}

Assistant:

int main()
{
  std::cout
#ifdef _LIBCPP_VERSION
  << "LLVM libc++"
#elif defined(_GLIBCXX_RELEASE)
  << "GNU GCC libstdc++"
#elif defined(_MSVC_STL_UPDATE)
  << "Microsoft STL"
#endif
  << " " << libcxx_release() << "\n";

  return EXIT_SUCCESS;
}